

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O3

void __thiscall diy::AMRLink::AMRLink(AMRLink *this)

{
  Bounds<int> BStack_108;
  Bounds<int> local_88;
  
  Bounds<int>::Bounds(&local_88,0);
  Bounds<int>::Bounds(&BStack_108,0);
  AMRLink(this,0,-1,0,&local_88,&BStack_108);
  BStack_108.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       BStack_108.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (BStack_108.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(BStack_108.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    BStack_108.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  BStack_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       BStack_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (BStack_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(BStack_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    BStack_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_88.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_88.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_88.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_88.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_88.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_88.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_88.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_88.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_88.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_88.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  return;
}

Assistant:

AMRLink(): AMRLink(0, -1, 0, Bounds(0), Bounds(0))                      {}